

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  sVar5 = self->block_len_;
  if (sVar5 == 0) {
    sVar5 = self->block_ix_;
    self->block_ix_ = sVar5 + 1;
    uVar9 = self->block_lengths_[sVar5 + 1];
    uVar8 = (ulong)self->block_types_[sVar5 + 1];
    self->block_len_ = (ulong)uVar9;
    self->entropy_ix_ = self->alphabet_size_ * uVar8;
    sVar5 = (self->block_split_code_).type_code_calculator.last_type;
    lVar6 = 1;
    if (sVar5 + 1 != uVar8) {
      lVar6 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar8) {
        lVar6 = uVar8 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar5;
    (self->block_split_code_).type_code_calculator.last_type = uVar8;
    bVar1 = (self->block_split_code_).type_depths[lVar6];
    uVar2 = (self->block_split_code_).type_bits[lVar6];
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_00118eca;
    if (0x38 < bVar1) goto LAB_00118ee9;
    uVar8 = *storage_ix;
    uVar7 = bVar1 + uVar8;
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)uVar2 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar7;
    uVar8 = 0xe;
    if (0x2f0 < uVar9) {
      uVar8 = 0x14;
    }
    uVar4 = 7;
    if (uVar9 < 0x29) {
      uVar4 = 0;
    }
    if (0xb0 < uVar9) {
      uVar4 = uVar8;
    }
    do {
      uVar8 = uVar4;
      if (uVar8 == 0x19) break;
      uVar4 = uVar8 + 1;
    } while (kBlockLengthPrefixCode[uVar8 + 1].offset <= uVar9);
    uVar8 = uVar8 & 0xffffffff;
    bVar1 = (self->block_split_code_).length_depths[uVar8];
    uVar2 = (self->block_split_code_).length_bits[uVar8];
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_00118eca;
    if (0x38 < bVar1) goto LAB_00118ee9;
    uVar3 = kBlockLengthPrefixCode[uVar8].nbits;
    uVar9 = uVar9 - kBlockLengthPrefixCode[uVar8].offset;
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)uVar2 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
    uVar7 = bVar1 + uVar7;
    *storage_ix = uVar7;
    if (uVar9 >> ((byte)uVar3 & 0x3f) != 0) goto LAB_00118eca;
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)uVar9 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
    *storage_ix = uVar3 + uVar7;
    sVar5 = self->block_len_;
  }
  self->block_len_ = sVar5 - 1;
  lVar6 = symbol + self->entropy_ix_;
  bVar1 = self->depths_[lVar6];
  if (self->bits_[lVar6] >> (bVar1 & 0x3f) == 0) {
    if (bVar1 < 0x39) {
      uVar8 = *storage_ix;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)self->bits_[lVar6] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      *storage_ix = bVar1 + uVar8;
      return;
    }
LAB_00118ee9:
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x37,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
LAB_00118eca:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->alphabet_size_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}